

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_component.hpp
# Opt level: O0

result_type * __thiscall
boost::spirit::detail::
make_directive<boost::spirit::karma::domain,_boost::spirit::meta_compiler<boost::spirit::karma::domain>::meta_grammar>
::impl<$ef43145c$>::operator()
          (result_type *__return_storage_ptr__,impl<_ef43145c_> *this,expr_param expr,
          state_param state,data_param data)

{
  detail *this_00;
  action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,_(boost::spirit::endian::endianness)2,_8>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::post_inc,_boost::proto::argsns_::list1<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>_>,_1L>_>_>,_2L>_>_>,_2L>_>_>
  *car;
  undefined1 local_162;
  undefined1 local_161;
  result_type local_160;
  cons<boost::spirit::karma::action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,_(boost::spirit::endian::endianness)2,_8>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::post_inc,_boost::proto::argsns_::list1<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>_>,_1L>_>_>,_2L>_>_>,_2L>_>_>,_boost::fusion::nil_>
  local_140;
  undefined1 local_118 [8];
  elements_type elements;
  lazy_terminal<boost::spirit::tag::repeat,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_>,_1>
  local_c8;
  modify<boost::spirit::karma::domain,void> local_a2;
  unused_type local_a1;
  detail *pdStack_a0;
  type modifier;
  tag_type tag;
  data_param data_local;
  state_param state_local;
  expr_param expr_local;
  impl<_ef43145c_> *this_local;
  impl<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::post_inc,_boost::proto::argsns_::list1<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>_>,_1L>_>_>,_2L>_>_>,_2L>_>_&>,_2L>_&,_const_boost::fusion::nil__&,_boost::spirit::unused_type_&>
  local_59;
  data_param local_58;
  state_param local_50;
  expr_param local_48;
  undefined1 *local_40;
  expr_param local_38;
  detail *local_30;
  expr_param local_28;
  expr_param local_20;
  expr_param local_18;
  expr_param local_10;
  
  pdStack_a0 = (detail *)expr->child0;
  local_30 = pdStack_a0;
  local_28 = expr;
  local_20 = expr;
  lazy_terminal<boost::spirit::tag::repeat,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_>,_1>
  ::lazy_terminal(&local_c8,
                  (lazy_terminal<boost::spirit::tag::repeat,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_>,_1>
                   *)pdStack_a0);
  modify<boost::spirit::karma::domain,void>::operator()(&local_a2,&local_c8);
  this_00 = pdStack_a0;
  local_48 = expr->child1;
  local_40 = &local_161;
  local_58 = &local_a1;
  local_50 = state;
  local_38 = expr;
  local_18 = expr;
  local_10 = expr;
  make_action<boost::spirit::karma::domain,_boost::spirit::meta_compiler<boost::spirit::karma::domain>::meta_grammar>
  ::
  impl<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::post_inc,_boost::proto::argsns_::list1<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>_>,_1L>_>_>,_2L>_>_>,_2L>_>_&>,_2L>_&,_const_boost::fusion::nil__&,_boost::spirit::unused_type_&>
  ::operator()(&local_160,&local_59,local_48,state,local_58);
  make_cons<boost::spirit::karma::action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,(boost::spirit::endian::endianness)2,8>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::argument<0>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::post_inc,boost::proto::argsns_::list1<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>>,0l>>>,1l>>>,2l>>>,2l>>>>
            (&local_140,(detail *)&local_160,car);
  make_cons<boost::spirit::lazy_terminal<boost::spirit::tag::repeat,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::stl::size>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,0l>>>,2l>>>,2l>>,1>,boost::fusion::cons<boost::spirit::karma::action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,(boost::spirit::endian::endianness)2,8>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::argument<0>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::post_inc,boost::proto::argsns_::list1<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>>,0l>>>,1l>>>,2l>>>,2l>>>,boost::fusion::nil_>>
            ((cons<boost::spirit::lazy_terminal<boost::spirit::tag::repeat,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_>,_1>,_boost::fusion::cons<boost::spirit::karma::action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,_(boost::spirit::endian::endianness)2,_8>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::post_inc,_boost::proto::argsns_::list1<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>_>,_1L>_>_>,_2L>_>_>,_2L>_>_>,_boost::fusion::nil_>_>
              *)local_118,this_00,
             (lazy_terminal<boost::spirit::tag::repeat,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_>,_1>
              *)&local_140,
             (cons<boost::spirit::karma::action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,_(boost::spirit::endian::endianness)2,_8>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::post_inc,_boost::proto::argsns_::list1<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>_>,_1L>_>_>,_2L>_>_>,_2L>_>_>,_boost::fusion::nil_>
              *)state);
  make_component<boost::spirit::karma::domain,boost::spirit::tag::directive,void>::operator()
            (__return_storage_ptr__,&local_162,
             (cons<boost::spirit::lazy_terminal<boost::spirit::tag::repeat,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_>,_1>,_boost::fusion::cons<boost::spirit::karma::action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,_(boost::spirit::endian::endianness)2,_8>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::post_inc,_boost::proto::argsns_::list1<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>_>,_1L>_>_>,_2L>_>_>,_2L>_>_>,_boost::fusion::nil_>_>
              *)local_118,data);
  return __return_storage_ptr__;
}

Assistant:

result_type operator()(
                typename impl::expr_param expr
              , typename impl::state_param state
              , typename impl::data_param data
            ) const
            {
                tag_type tag = proto::value(proto::child_c<0>(expr));
                typename remove_reference<modifier_type>::type
                    modifier = modify<Domain>()(tag, data);

                elements_type elements =
                    detail::make_cons(
                        tag                                 // LHS
                      , detail::make_cons(
                            Grammar()(
                                proto::child_c<1>(expr)     // RHS
                              , state, modifier)
                        )
                    );

                return make_component_()(elements, data);
            }